

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.cpp
# Opt level: O2

void chai_puppet(ChaiScript *chai,NameMap *namemap,string *script_prefix)

{
  pointer pTVar1;
  Dispatch_Engine *this;
  undefined8 uVar2;
  Proxy_Function_Base *pPVar3;
  pointer *ppTVar4;
  _func_bool_Puppet_ptr *extraout_RDX;
  _func_shared_ptr<henson::Puppet>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ProcMap_ptr
  *extraout_RDX_00;
  _func_bool_PythonPuppet_ptr *extraout_RDX_01;
  _func_shared_ptr<henson::PythonPuppet>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ProcMap_ptr
  *extraout_RDX_02;
  Type_Conversions *this_00;
  undefined1 local_b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a8 [16];
  undefined8 uStack_98;
  undefined1 local_90 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  uint local_80;
  _Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_68;
  Proxy_Function local_50;
  NameMap *local_40;
  string *local_38;
  
  local_90 = (undefined1  [8])&henson::BaseCoroutine::typeinfo;
  local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&henson::BaseCoroutine::typeinfo;
  local_80 = 0;
  std::__cxx11::string::string((string *)local_b8,"BaseCoroutine",(allocator *)&local_68);
  this = &chai->m_engine;
  chaiscript::detail::Dispatch_Engine::add(this,(Type_Info *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  chaiscript::fun<bool,henson::BaseCoroutine>((offset_in_BaseCoroutine_to_subr)local_90);
  std::__cxx11::string::string((string *)local_b8,"running",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,(Proxy_Function *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  chaiscript::fun<void,henson::BaseCoroutine>((offset_in_BaseCoroutine_to_subr)local_90);
  std::__cxx11::string::string((string *)local_b8,"signal_stop",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,(Proxy_Function *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  chaiscript::fun<unsigned_long_long,henson::BaseCoroutine>
            ((offset_in_BaseCoroutine_to_subr)local_90);
  std::__cxx11::string::string((string *)local_b8,"total_time",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,(Proxy_Function *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  chaiscript::fun<std::__cxx11::string_const&,henson::BaseCoroutine>
            ((offset_in_BaseCoroutine_to_subr)local_90);
  std::__cxx11::string::string((string *)local_b8,"name",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,(Proxy_Function *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  chaiscript::
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Static_Conversion_Impl<henson::BaseCoroutine,henson::Puppet>>
            ();
  this_00 = &(chai->m_engine).m_conversions;
  chaiscript::Type_Conversions::add_conversion
            (this_00,(shared_ptr<chaiscript::detail::Type_Conversion_Base> *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  local_90 = (undefined1  [8])&henson::Puppet::typeinfo;
  local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&henson::Puppet::typeinfo;
  local_80 = 0;
  std::__cxx11::string::string((string *)local_b8,"Puppet",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,(Type_Info *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  pPVar3 = (Proxy_Function_Base *)operator_new(0x28);
  chaiscript::dispatch::detail::build_param_type_list<bool,henson::Puppet&>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_b8,
             (detail *)0x0,extraout_RDX);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar3,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_b8);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            ((_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_b8
            );
  pPVar3->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_00320128;
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2> *)
             local_90,pPVar3);
  std::__cxx11::string::string((string *)local_b8,"proceed",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,(Proxy_Function *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  local_90 = (undefined1  [8])namemap;
  std::__cxx11::string::string((string *)&local_88,(string *)script_prefix);
  pPVar3 = (Proxy_Function_Base *)operator_new(0x50);
  local_b8 = local_90;
  local_40 = namemap;
  local_38 = script_prefix;
  std::__cxx11::string::string((string *)&local_b0,(string *)&local_88);
  chaiscript::dispatch::detail::
  build_param_type_list<std::shared_ptr<henson::Puppet>,std::__cxx11::string,henson::ProcMap*>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_68,
             (detail *)0x0,extraout_RDX_00);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar3,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_68);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_68);
  uVar2 = local_a8._0_8_;
  pPVar3->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Callable_Impl_003201a0;
  pTVar1 = (pointer)(local_a8 + 8);
  pPVar3[1]._vptr_Proxy_Function_Base = (_func_int **)local_b8;
  ppTVar4 = &pPVar3[1].m_types.
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar3[1].m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppTVar4;
  if ((pointer)local_b0._M_pi == pTVar1) {
    *ppTVar4 = (pointer)CONCAT71(local_a8._9_7_,local_a8[8]);
    pPVar3[1].m_arity = (undefined4)uStack_98;
    pPVar3[1].m_has_arithmetic_param = (bool)uStack_98._4_1_;
    *(undefined3 *)&pPVar3[1].field_0x25 = uStack_98._5_3_;
  }
  else {
    pPVar3[1].m_types.
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b0._M_pi;
    pPVar3[1].m_types.
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(local_a8._9_7_,local_a8[8]);
  }
  local_a8._0_8_ = (pointer)0x0;
  pPVar3[1].m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)uVar2;
  local_a8[8] = '\0';
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar1;
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2> *)
             &local_50,pPVar3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)local_b8,"load",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,&local_50,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_88);
  chaiscript::
  make_shared<chaiscript::detail::Type_Conversion_Base,chaiscript::detail::Static_Conversion_Impl<henson::BaseCoroutine,henson::PythonPuppet>>
            ();
  chaiscript::Type_Conversions::add_conversion
            (this_00,(shared_ptr<chaiscript::detail::Type_Conversion_Base> *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_b0);
  local_90 = (undefined1  [8])&henson::PythonPuppet::typeinfo;
  local_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&henson::PythonPuppet::typeinfo;
  local_80 = 0;
  std::__cxx11::string::string((string *)local_b8,"PythonPuppet",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,(Type_Info *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  pPVar3 = (Proxy_Function_Base *)operator_new(0x28);
  chaiscript::dispatch::detail::build_param_type_list<bool,henson::PythonPuppet&>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_b8,
             (detail *)0x0,extraout_RDX_01);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar3,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_b8);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            ((_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)local_b8
            );
  pPVar3->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Base_00320218;
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2> *)
             local_90,pPVar3);
  std::__cxx11::string::string((string *)local_b8,"proceed",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,(Proxy_Function *)local_90,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
  local_90 = (undefined1  [8])local_40;
  std::__cxx11::string::string((string *)&local_88,(string *)local_38);
  pPVar3 = (Proxy_Function_Base *)operator_new(0x50);
  local_b8 = local_90;
  std::__cxx11::string::string((string *)&local_b0,(string *)&local_88);
  chaiscript::dispatch::detail::
  build_param_type_list<std::shared_ptr<henson::PythonPuppet>,std::__cxx11::string,henson::ProcMap*>
            ((vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_68,
             (detail *)0x0,extraout_RDX_02);
  chaiscript::dispatch::Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            ((Proxy_Function_Impl_Base *)pPVar3,
             (vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *)&local_68);
  std::_Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::~_Vector_base
            (&local_68);
  uVar2 = local_a8._0_8_;
  pPVar3->_vptr_Proxy_Function_Base = (_func_int **)&PTR__Proxy_Function_Callable_Impl_00320290;
  pPVar3[1]._vptr_Proxy_Function_Base = (_func_int **)local_b8;
  ppTVar4 = &pPVar3[1].m_types.
             super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar3[1].m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)ppTVar4;
  if ((pointer)local_b0._M_pi == pTVar1) {
    *ppTVar4 = (pointer)CONCAT71(local_a8._9_7_,local_a8[8]);
    pPVar3[1].m_arity = (undefined4)uStack_98;
    pPVar3[1].m_has_arithmetic_param = (bool)uStack_98._4_1_;
    *(undefined3 *)&pPVar3[1].field_0x25 = uStack_98._5_3_;
  }
  else {
    pPVar3[1].m_types.
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_b0._M_pi;
    pPVar3[1].m_types.
    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(local_a8._9_7_,local_a8[8]);
  }
  local_a8._0_8_ = 0;
  pPVar3[1].m_types.
  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)uVar2;
  local_a8[8] = '\0';
  local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pTVar1;
  std::__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((__shared_ptr<chaiscript::dispatch::Proxy_Function_Base,(__gnu_cxx::_Lock_policy)2> *)
             &local_50,pPVar3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)local_b8,"python",(allocator *)&local_68);
  chaiscript::detail::Dispatch_Engine::add(this,&local_50,(string *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.
              super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

void chai_puppet(chaiscript::ChaiScript& chai, henson::NameMap& namemap, std::string script_prefix)
{
    // BaseCoroutine
    chai.add(chaiscript::user_type<h::BaseCoroutine>(), "BaseCoroutine");
    chai.add(chaiscript::fun(&h::BaseCoroutine::running),      "running");
    chai.add(chaiscript::fun(&h::BaseCoroutine::signal_stop),  "signal_stop");
    chai.add(chaiscript::fun(&h::BaseCoroutine::total_time),   "total_time");
    chai.add(chaiscript::fun(&h::BaseCoroutine::name),         "name");

    // Puppet
    chai.add(chaiscript::base_class<h::BaseCoroutine, h::Puppet>());
    chai.add(chaiscript::user_type<h::Puppet>(),        "Puppet");
    chai.add(chaiscript::fun([](h::Puppet& puppet)
    {
        active_puppet = puppet.name();
        logger->debug("Proceeding with {}", puppet.name());
        puppet.proceed();
        return puppet.running();
    }), "proceed");

    chai.add(chaiscript::fun([&namemap,script_prefix](std::string cmd_line_str, henson::ProcMap* pm)
    {
        auto cmd_line = h::CommandLine(cmd_line_str);
        return std::make_shared<h::Puppet>(cmd_line.executable(script_prefix),
                                           cmd_line.argv.size(),
                                           &cmd_line.argv[0],
                                           pm,
                                           &namemap);
    }), "load");

#ifdef HENSON_PYTHON
    // PythonPuppet
    chai.add(chaiscript::base_class<h::BaseCoroutine, h::PythonPuppet>());
    chai.add(chaiscript::user_type<h::PythonPuppet>(),  "PythonPuppet");
    chai.add(chaiscript::fun([](h::PythonPuppet& puppet)
    {
        active_puppet = puppet.name();
        logger->debug("Proceeding with {}", puppet.name());
        puppet.proceed();
        return puppet.running();
    }), "proceed");
    chai.add(chaiscript::fun([&namemap,script_prefix](std::string python_cmd_line_str, henson::ProcMap* pm)
    {
        auto cmd_line = h::CommandLine(python_cmd_line_str);
        return std::make_shared<h::PythonPuppet>(cmd_line.executable(script_prefix), cmd_line.argv, pm, &namemap);
    }), "python");
#endif
}